

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WaveletTree.h
# Opt level: O1

void __thiscall bwtil::WaveletTree::WaveletTree(WaveletTree *this,string *text,bool verbose)

{
  byte bVar1;
  size_type sVar2;
  pointer pcVar3;
  uint uVar4;
  uint uVar5;
  ostream *poVar6;
  ulong uVar7;
  ulong uVar8;
  undefined8 uVar9;
  int iVar10;
  undefined7 in_register_00000011;
  size_type sVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  bool bVar16;
  undefined1 auVar17 [64];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar18 [16];
  undefined1 in_ZMM1 [64];
  undefined1 extraout_var_00 [56];
  allocator_type local_7d;
  int local_7c;
  vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_> *local_78;
  string *local_70;
  vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_> local_68;
  vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_> local_48;
  undefined1 extraout_var [56];
  undefined1 auVar19 [64];
  
  auVar18 = in_ZMM1._0_16_;
  local_78 = &this->nodes;
  (this->nodes).
  super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nodes).
  super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nodes).
  super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((int)CONCAT71(in_register_00000011,verbose) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  Building Wavelet tree",0x17);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    auVar19._8_56_ = extraout_var_00;
    auVar19._0_8_ = extraout_XMM1_Qa;
    auVar18 = auVar19._0_16_;
  }
  sVar2 = text->_M_string_length;
  this->n = sVar2;
  this->sigma = 0;
  if (sVar2 != 0) {
    uVar5 = this->sigma;
    pcVar3 = (text->_M_dataplus)._M_p;
    sVar11 = 0;
    do {
      bVar1 = pcVar3[sVar11];
      if (uVar5 < bVar1) {
        this->sigma = (uint)bVar1;
        uVar5 = (uint)bVar1;
      }
      sVar11 = sVar11 + 1;
    } while (sVar2 != sVar11);
  }
  uVar4 = this->sigma + 1;
  this->sigma = uVar4;
  auVar18 = vcvtusi2sd_avx512f(auVar18,uVar4);
  auVar17._0_8_ = log2(auVar18._0_8_);
  auVar17._8_56_ = extraout_var;
  auVar18 = vroundsd_avx(auVar17._0_16_,auVar17._0_16_,10);
  uVar5 = vcvttsd2usi_avx512f(auVar18);
  this->log_sigma = uVar5;
  this->number_of_nodes = ~(-1L << ((ulong)uVar5 & 0x3f));
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   Number of nodes = ",0x15);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    if (verbose) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"   filling nodes ... ",0x15);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
      std::ostream::put('\b');
      std::ostream::flush();
    }
  }
  std::vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>::vector
            (&local_68,this->number_of_nodes,&local_7d);
  local_48.super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (this->nodes).
       super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_48.super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (this->nodes).
       super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->nodes).
       super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->nodes).
  super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_68.
       super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->nodes).
  super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_68.
       super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->nodes).
  super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_68.
       super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68.super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>::~vector
            (&local_48);
  std::vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>::~vector
            (&local_68);
  if (this->n != 0) {
    uVar13 = 0;
    uVar8 = 0;
    iVar15 = -1;
    local_70 = text;
    do {
      iVar14 = (int)uVar8;
      bVar16 = (iVar14 * -0x33333333 + 0x19999998U >> 1 | iVar14 * -0x80000000) < 0x19999999;
      iVar10 = iVar15;
      if (bVar16 && iVar15 < iVar14) {
        iVar10 = iVar14;
      }
      if ((bVar16 && iVar15 < iVar14) && verbose) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   ",3);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"% done.",7);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        iVar10 = iVar14;
      }
      uVar8 = (ulong)this->log_sigma;
      local_7c = iVar10;
      if (this->log_sigma != 0) {
        iVar15 = -1;
        uVar12 = 0;
        uVar7 = 0;
        do {
          if (text->_M_string_length <= uVar13) {
            uVar9 = std::__throw_out_of_range_fmt
                              ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)"
                               ,uVar13);
            std::vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>::
            ~vector(local_78);
            _Unwind_Resume(uVar9);
          }
          uVar5 = 1 << ((int)uVar8 + iVar15 & 0x1fU) & (uint)(byte)(text->_M_dataplus)._M_p[uVar13];
          uVar8 = uVar7 & 0xffffffff;
          succinct_bitvector::push_back
                    ((local_78->
                     super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>
                     )._M_impl.super__Vector_impl_data._M_start + uVar8,uVar5 != 0);
          uVar7 = uVar8 * 2 + 1;
          if (uVar5 != 0) {
            uVar7 = uVar8 * 2 + 2;
          }
          uVar12 = uVar12 + 1;
          uVar8 = (ulong)this->log_sigma;
          iVar15 = iVar15 + -1;
          text = local_70;
        } while (uVar12 < uVar8);
      }
      uVar8 = (uVar13 * 100) / this->n;
      uVar13 = uVar13 + 1;
      iVar15 = local_7c;
    } while (uVar13 < this->n);
  }
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   Done.",8);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
  }
  return;
}

Assistant:

WaveletTree(const string &text, bool verbose=false){

		if (verbose) cout << "  Building Wavelet tree"<<endl;

		this->n = text.length();
		sigma = 0;

		for(ulint i=0;i<n;i++)
			if((uchar)text.at(i)>sigma)
				sigma = (uchar)text.at(i);

		sigma++;

		log_sigma = ceil(log2(sigma));

		number_of_nodes = ((ulint)1<<log_sigma)-1;

		if (verbose) cout << "   Number of nodes = "<< number_of_nodes << endl;

		if (verbose) cout << "   filling nodes ... " << endl;

		nodes = vector<succinct_bitvector>(number_of_nodes);

		uint node = root();

		int perc=0,last_perc=-1;

		for(ulint i=0;i<n;i++){

			if(perc>last_perc and perc%10==0){

				if (verbose) cout << "   " << perc << "% done." <<endl;
				last_perc=perc;

			}

			for(ulint j=0;j<log_sigma;j++){

				bool bit = bitInChar((uchar)text.at(i),j);

				nodes[node].push_back(bit);

				node = (bit?child1(node):child0(node));

			}

			node = root();

			perc = (100*i)/n;

		}

		if (verbose) cout << "   Done." << endl;

	}